

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
::emplace_new_key<slang::syntax::SyntaxNode_const*>
          (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SyntaxNode **key)

{
  char cVar1;
  SyntaxNode *pSVar2;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 aVar3;
  EntryPointer psVar4;
  EntryPointer psVar5;
  EntryPointer psVar6;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 in_RAX;
  sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
  sVar7;
  long lVar8;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar12;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 local_18;
  
  local_18 = in_RAX;
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
       )distance_from_desired)) {
    aVar9.value = (SyntaxNode *)(*(long *)(this + 0x20) + 1);
    auVar10._8_4_ = aVar9._4_4_;
    auVar10._0_8_ = aVar9.value;
    auVar10._12_4_ = 0x45300000;
    lVar8 = *(long *)(this + 0x10) + 1;
    auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = 0x45300000;
    if ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,aVar9._0_4_) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      cVar1 = current_entry->distance_from_desired;
      if (cVar1 < '\0') {
        (current_entry->field_1).value = *key;
        current_entry->distance_from_desired = distance_from_desired;
        ((anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 *)
        (this + 0x20))->value = (SyntaxNode *)aVar9;
      }
      else {
        pSVar2 = *key;
        current_entry->distance_from_desired = distance_from_desired;
        aVar9 = current_entry->field_1;
        (current_entry->field_1).value = pSVar2;
        sVar7 = (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                 )(cVar1 + '\x01');
        cVar1 = current_entry[1].distance_from_desired;
        psVar6 = current_entry + 1;
        psVar5 = current_entry;
        while (psVar4 = psVar6, -1 < cVar1) {
          if (cVar1 < (char)sVar7) {
            psVar4->distance_from_desired = (int8_t)sVar7;
            aVar3 = psVar4->field_1;
            psVar4->field_1 = aVar9;
            sVar7 = (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                     )(cVar1 + '\x01');
            aVar9 = aVar3;
          }
          else {
            sVar7 = (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                     )((char)sVar7 + '\x01');
            if (sVar7 == this[0x19]) {
              local_18 = current_entry->field_1;
              current_entry->field_1 = aVar9;
              key = (SyntaxNode **)&local_18;
              goto LAB_00286da6;
            }
          }
          psVar6 = psVar4 + 1;
          psVar5 = psVar4;
          cVar1 = psVar4[1].distance_from_desired;
        }
        psVar5[1].field_1 = aVar9;
        psVar4->distance_from_desired = (int8_t)sVar7;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      }
      pVar12._9_7_ = aVar9._1_7_;
      pVar12.second = true;
      pVar12.first.current = current_entry;
      return pVar12;
    }
  }
LAB_00286da6:
  sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  ::grow((sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
          *)this);
  pVar12 = emplace<slang::syntax::SyntaxNode_const*>(this,key);
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }